

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readxm.c
# Opt level: O0

int it_xm_read_sample_data(IT_SAMPLE *sample,uchar roguebytes,DUMBFILE *f)

{
  int32 iVar1;
  int iVar2;
  void *pvVar3;
  short *psVar4;
  sbyte sVar5;
  DUMBFILE *in_RDX;
  char in_SIL;
  IT_SAMPLE *in_RDI;
  void *ibuffer;
  int old_r;
  short *output;
  int32 outlen;
  int32 datasizebytes;
  int n_channels;
  int32 i;
  int old;
  long in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int iVar6;
  undefined8 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int local_28;
  int local_24;
  undefined7 in_stack_ffffffffffffffe8;
  int local_4;
  
  iVar1 = (int32)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  if ((in_RDI->flags & 1) == 0) {
    local_4 = dumbfile_skip((DUMBFILE *)
                            CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                            in_stack_ffffffffffffffb0);
  }
  else {
    iVar6 = in_RDI->length;
    pvVar3 = malloc((long)iVar6);
    in_RDI->data = pvVar3;
    if (in_RDI->data == (void *)0x0) {
      local_4 = -1;
    }
    else if (in_SIL == '\x04') {
      iVar1 = _dumb_it_read_sample_data_adpcm4
                        ((IT_SAMPLE *)CONCAT17(4,in_stack_ffffffffffffffe8),in_RDX);
      if (iVar1 < 0) {
        local_4 = -1;
      }
      else {
        local_4 = 0;
      }
    }
    else {
      dumbfile_getnc((char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),iVar1,
                     (DUMBFILE *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      iVar2 = dumbfile_error(in_RDX);
      if (iVar2 == 0) {
        if ((*(int *)((long)in_RDI->data + 4) == 0x5367674f) &&
           (iVar2 = memcmp((void *)((long)in_RDI->data + 0x21),"vorbis",7), iVar2 == 0)) {
          iVar2 = CONCAT13(*(undefined1 *)((long)in_RDI->data + 3),
                           CONCAT12(*(undefined1 *)((long)in_RDI->data + 2),
                                    CONCAT11(*(undefined1 *)((long)in_RDI->data + 1),*in_RDI->data))
                          );
          if ((in_RDI->flags & 2) == 0) {
            iVar2 = iVar2 << 1;
          }
          if ((in_RDI->flags & 4) != 0) {
            in_RDI->flags = in_RDI->flags & 0xfb;
            iVar2 = iVar2 >> 1;
            in_RDI->loop_start = in_RDI->loop_start >> 1;
            in_RDI->loop_end = in_RDI->loop_end >> 1;
          }
          psVar4 = dumb_decode_vorbis(iVar2,(void *)((long)in_RDI->data + 4),iVar6 + -4);
          if (psVar4 != (short *)0x0) {
            free(in_RDI->data);
            in_RDI->data = psVar4;
            in_RDI->length = iVar2;
            if ((in_RDI->flags & 2) == 0) {
              in_RDI->flags = in_RDI->flags | 2;
              in_RDI->loop_start = in_RDI->loop_start << 1;
              in_RDI->loop_end = in_RDI->loop_end << 1;
            }
            it_xm_fixup_sample_points(in_RDI);
            return 0;
          }
        }
        it_xm_fixup_sample_points(in_RDI);
        local_24 = 0;
        if ((in_RDI->flags & 4) != 0) {
          iVar6 = 0;
          sVar5 = 1;
          if ((in_RDI->flags & 2) != 0) {
            sVar5 = 2;
          }
          pvVar3 = malloc((long)(in_RDI->length << sVar5));
          if (pvVar3 == (void *)0x0) {
            in_RDI->flags = in_RDI->flags & 0xfb;
          }
          else if ((in_RDI->flags & 2) == 0) {
            for (local_28 = 0; local_28 < in_RDI->length; local_28 = local_28 + 1) {
              local_24 = *(char *)((long)in_RDI->data + (long)local_28) + local_24;
              *(char *)((long)pvVar3 + (long)(local_28 << 1)) = (char)local_24;
              iVar6 = *(char *)((long)in_RDI->data + (long)(local_28 + in_RDI->length)) + iVar6;
              *(char *)((long)pvVar3 + (long)(local_28 * 2 + 1)) = (char)iVar6;
            }
          }
          else {
            for (local_28 = 0; local_28 < in_RDI->length; local_28 = local_28 + 1) {
              iVar2 = iswapw((int)*(short *)((long)in_RDI->data + (long)local_28 * 2));
              local_24 = iVar2 + local_24;
              *(short *)((long)pvVar3 + (long)(local_28 << 1) * 2) = (short)local_24;
              iVar2 = iswapw((int)*(short *)((long)in_RDI->data +
                                            (long)(local_28 + in_RDI->length) * 2));
              iVar6 = iVar2 + iVar6;
              *(short *)((long)pvVar3 + (long)(local_28 * 2 + 1) * 2) = (short)iVar6;
            }
          }
          if (pvVar3 != (void *)0x0) {
            free(in_RDI->data);
            in_RDI->data = pvVar3;
          }
        }
        if ((in_RDI->flags & 4) == 0) {
          if ((in_RDI->flags & 2) == 0) {
            for (local_28 = 0; local_28 < in_RDI->length; local_28 = local_28 + 1) {
              local_24 = *(char *)((long)in_RDI->data + (long)local_28) + local_24;
              *(char *)((long)in_RDI->data + (long)local_28) = (char)local_24;
            }
          }
          else {
            for (local_28 = 0; local_28 < in_RDI->length; local_28 = local_28 + 1) {
              iVar6 = iswapw((int)*(short *)((long)in_RDI->data + (long)local_28 * 2));
              local_24 = iVar6 + local_24;
              *(short *)((long)in_RDI->data + (long)local_28 * 2) = (short)local_24;
            }
          }
        }
        local_4 = 0;
      }
      else {
        local_4 = -1;
      }
    }
  }
  return local_4;
}

Assistant:

static int it_xm_read_sample_data(IT_SAMPLE *sample, unsigned char roguebytes, DUMBFILE *f)
{
	int old;
	int32 i;
//	long truncated_size;
	int n_channels;
	int32 datasizebytes;

	if (!(sample->flags & IT_SAMPLE_EXISTS))
		return dumbfile_skip(f, roguebytes);

#if 0
	/* let's get rid of the sample data coming after the end of the loop */
	if ((sample->flags & IT_SAMPLE_LOOP) && sample->loop_end < sample->length && roguebytes != 4) {
		truncated_size = sample->length - sample->loop_end;
		sample->length = sample->loop_end;
	} else {
		truncated_size = 0;
	}
#endif
	n_channels = sample->flags & IT_SAMPLE_STEREO ? 2 : 1;
	datasizebytes = sample->length;

	sample->data = malloc(datasizebytes);
	if (!sample->data)
		return -1;

	if (roguebytes == 4)
	{
		if (_dumb_it_read_sample_data_adpcm4(sample, f) < 0)
			return -1;
		return 0;
	}

	dumbfile_getnc(sample->data, datasizebytes, f);

	if (dumbfile_error(f))
		return -1;

	/* FMOD extension: Samples compressed with Ogg Vorbis */
	if (!memcmp((char *)sample->data + 4, "OggS", 4) &&
		!memcmp((char *)sample->data + 33, "vorbis", 7))
	{
		int32 outlen = ((unsigned char *)(sample->data))[0] |
					  (((unsigned char *)(sample->data))[1] << 8) |
					  (((unsigned char *)(sample->data))[2] << 16) |
					  (((unsigned char *)(sample->data))[3] << 24);
		short *output;

		if (!(sample->flags & IT_SAMPLE_16BIT))
		{
			/* Because it'll be 16-bit when we're done with it. */
			outlen <<= 1;
		}

		if (sample->flags & IT_SAMPLE_STEREO)
		{
			/* OggMod knows nothing of stereo samples and compresses them as mono,
			 * screwing up the second channel. (Because for whatever reason,
			 * ModPlug delta encodes them independantly, even though it presents
			 * the sample as a double-length mono sound to other players.)
			 */
			sample->flags &= ~IT_SAMPLE_STEREO;
			outlen >>= 1;
			sample->loop_start >>= 1;
			sample->loop_end >>= 1;
		}
		output = dumb_decode_vorbis(outlen, (char *)sample->data + 4, datasizebytes - 4);
		if (output != NULL)
		{
			free(sample->data);
			sample->data = output;
			sample->length = outlen;
			if (!(sample->flags & IT_SAMPLE_16BIT))
			{
				sample->flags |= IT_SAMPLE_16BIT;
				sample->loop_start <<= 1;
				sample->loop_end <<= 1;
			}

			it_xm_fixup_sample_points(sample);
			return 0;
		}
		/* Decode failed, so assume it's normal sample data that just so
		 * happened to look like a Vorbis stream. (Not likely to happen
		 * by coincidence!) */
	}

	it_xm_fixup_sample_points(sample);

	/* sample data is stored as signed delta values */
	old = 0;
	if (sample->flags & IT_SAMPLE_STEREO)
	{
		/* Stereo samples are a ModPlug extension, so to keep compatibility with
		 * players that don't know about it (and FastTracker 2 itself), the two
		 * channels are not stored interleaved but rather, one after the other. */
		int old_r = 0;
		void *ibuffer = malloc(sample->length << ((sample->flags & IT_SAMPLE_16BIT) ? 2 : 1));
		if (ibuffer == NULL)
		{
			/* No memory => ignore stereo bits at the end */
			sample->flags &= ~IT_SAMPLE_STEREO;
		}
		else if (sample->flags & IT_SAMPLE_16BIT)
		{
			for (i = 0; i < sample->length; i++)
			{
				((short *)ibuffer)[i*2]   = old += iswapw(((short *)sample->data)[i]);
				((short *)ibuffer)[i*2+1] = old_r += iswapw(((short *)sample->data)[i + sample->length]);
			}
		}
		else
		{
			for (i = 0; i < sample->length; i++)
			{
				((char *)ibuffer)[i*2]   = old += ((char *)sample->data)[i];
				((char *)ibuffer)[i*2+1] = old_r += ((char *)sample->data)[i + sample->length];
			}
		}
		if (ibuffer != NULL)
		{
			free(sample->data);
			sample->data = ibuffer;
		}
	}
	if (!(sample->flags & IT_SAMPLE_STEREO))
	{
		if (sample->flags & IT_SAMPLE_16BIT)
		{
			for (i = 0; i < sample->length; i++)
				((short *)sample->data)[i] = old += iswapw(((short *)sample->data)[i]);
		}
		else
		{
			for (i = 0; i < sample->length; i++)
				((char *)sample->data)[i] = old += ((char *)sample->data)[i];
		}
	}
	return 0;
}